

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_util.cpp
# Opt level: O0

json json_read_safe(json *j,string *key,string *default_to)

{
  bool bVar1;
  undefined4 *puVar2;
  ostream *poVar3;
  string *in_RCX;
  string *in_RDX;
  json_value extraout_RDX;
  key_type *in_RDI;
  json jVar4;
  int e;
  value_type data_item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffff48;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffff50;
  void *in_stack_ffffffffffffff58;
  const_reference in_stack_ffffffffffffff60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffffb0;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator[](in_stack_ffffffffffffffb0,in_RDI);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
  bVar1 = nlohmann::operator==<std::nullptr_t,_0>
                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    if (bVar1) {
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 0x16;
      __cxa_throw(puVar2,&int::typeinfo,0);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"Key: ");
    poVar3 = std::operator<<(poVar3,in_RDX);
    poVar3 = std::operator<<(poVar3," not found. Defaulting to: ");
    poVar3 = std::operator<<(poVar3,in_RCX);
    in_stack_ffffffffffffff40 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::operator<<(poVar3," method");
    std::ostream::operator<<(in_stack_ffffffffffffff40,std::endl<char,std::char_traits<char>>);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffff40);
  jVar4.m_value.object = extraout_RDX.object;
  jVar4._0_8_ = in_RDI;
  return jVar4;
}

Assistant:

json json_read_safe(json j, string key, string default_to){

    try {
        auto data_item = j[key];

        if(data_item==nullptr) {
            if(default_to=="0") throw 22;
            cout<<"Key: "<<key<< " not found. Defaulting to: "<<default_to<<" method"<<endl;
            return default_to;
        }

        return data_item;
    }
    catch (int e)
    {
        // output exception information
        cout<<"Error. Key '"<<key<<"' does not exist!"<<endl;
        exit(23);
    }

}